

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O3

void __thiscall SDLInputJoystickManager::SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  uint uVar1;
  int iVar2;
  SDLInputJoystick *this_00;
  int DeviceIndex;
  
  (this->Joysticks).Array = (SDLInputJoystick **)0x0;
  (this->Joysticks).Most = 0;
  (this->Joysticks).Count = 0;
  DeviceIndex = 0;
  while( true ) {
    iVar2 = SDL_NumJoysticks();
    if (iVar2 <= DeviceIndex) break;
    this_00 = (SDLInputJoystick *)operator_new(0x38);
    SDLInputJoystick::SDLInputJoystick(this_00,DeviceIndex);
    if (this_00->Device == (SDL_Joystick *)0x0) {
      (*(this_00->super_IJoystickConfig)._vptr_IJoystickConfig[1])(this_00);
    }
    else {
      TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::Grow(&this->Joysticks,1);
      uVar1 = (this->Joysticks).Count;
      (this->Joysticks).Array[uVar1] = this_00;
      (this->Joysticks).Count = uVar1 + 1;
    }
    DeviceIndex = DeviceIndex + 1;
  }
  return;
}

Assistant:

SDLInputJoystickManager()
	{
		for(int i = 0;i < SDL_NumJoysticks();i++)
		{
			SDLInputJoystick *device = new SDLInputJoystick(i);
			if(device->IsValid())
				Joysticks.Push(device);
			else
				delete device;
		}
	}